

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O2

bool __thiscall
ON_LocalZero1::BracketZero(ON_LocalZero1 *this,double s0,double f0,double s1,double f1,int level)

{
  bool bVar1;
  int iVar2;
  double s1_00;
  long lStack_70;
  double f;
  double local_58;
  double local_50;
  double local_48;
  double local_38;
  double d;
  
  if ((((f0 <= 0.0) && (0.0 <= f1)) || ((0.0 <= f0 && (f1 <= 0.0)))) ||
     ((ABS(f0) <= this->m_f_tolerance || (ABS(f1) <= this->m_f_tolerance)))) {
    this->m_t0 = s0;
    lStack_70 = 0x10;
    goto LAB_0056fb47;
  }
  if (8 < level) {
    return false;
  }
  s1_00 = s0 * 0.5 + s1;
  if (s1_00 <= s0) {
    return false;
  }
  if (s1 <= s1_00) {
    return false;
  }
  local_58 = s0;
  local_50 = s1;
  local_48 = f0;
  local_38 = f1;
  iVar2 = (*this->_vptr_ON_LocalZero1[2])(s1_00,this,&f,&d,0);
  if ((char)iVar2 == '\0') {
    return false;
  }
  iVar2 = level + 1;
  if (0.0 <= d * f) {
    bVar1 = BracketZero(this,local_58,local_48,s1_00,f,iVar2);
    if (bVar1) goto LAB_0056fc75;
    bVar1 = BracketZero(this,s1_00,f,local_50,local_38,iVar2);
    if (!bVar1) {
      return false;
    }
  }
  else {
    bVar1 = BracketZero(this,s1_00,f,local_50,local_38,iVar2);
    if (!bVar1) {
      bVar1 = BracketZero(this,local_58,local_48,s1_00,f,iVar2);
      if (!bVar1) {
        return false;
      }
LAB_0056fc75:
      this->m_s0 = local_58;
      this->m_f0 = local_48;
      this->m_s1 = s1_00;
      lStack_70 = 0x50;
      s1 = f;
      goto LAB_0056fb47;
    }
  }
  this->m_s0 = s1_00;
  this->m_f0 = f;
  this->m_s1 = local_50;
  lStack_70 = 0x50;
  s1 = local_38;
LAB_0056fb47:
  *(double *)((long)&this->_vptr_ON_LocalZero1 + lStack_70) = s1;
  return true;
}

Assistant:

bool
ON_LocalZero1::BracketZero( double s0, double f0, 
                             double s1, double f1,
                             int level )
{
  double s, f, d;

  // private helper for FindSearchDomain()
  if (    (f0 <= 0.0 && f1 >= 0.0) || (f0 >= 0.0 && f1 <= 0.0)
       || fabs(f0) <= m_f_tolerance || fabs(f1) <= m_f_tolerance ) {
    m_t0 = s0;
    m_t1 = s1;
    return true;
  }

  if ( level++ <= 8 ) {
    s = 0.5*s0+s1;
    if ( s0 < s && s < s1 && Evaluate(s,&f,&d,0) ) {
      if ( f*d >= 0.0 ) {
        // search left side first
        if ( BracketZero(s0,f0,s,f,level ) ) {
          m_s0 = s0;
          m_f0 = f0;
          m_s1 = s;
          m_f1 = f;
          return true;
        }
        if ( BracketZero(s,f,s1,f1,level ) ) {
          m_s0 = s;
          m_f0 = f;
          m_s1 = s1;
          m_f1 = f1;
          return true;
        }
      }
      else {
        // search right side first
        if ( BracketZero(s,f,s1,f1,level ) ) {
          m_s0 = s;
          m_f0 = f;
          m_s1 = s1;
          m_f1 = f1;
          return true;
        }
        if ( BracketZero(s0,f0,s,f,level ) ) {
          m_s0 = s0;
          m_f0 = f0;
          m_s1 = s;
          m_f1 = f;
          return true;
        }
      }
    }
  }
  return false;
}